

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vocab.c
# Opt level: O3

void ReadUTF8(FILE *fp)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  char *pcVar4;
  size_t sVar5;
  size_t __size;
  size_t local_30;
  SerializerParam param;
  
  fgets(iobuf,200000,(FILE *)fp);
  iVar1 = atoi(iobuf);
  vocab = HashVocab_init((long)iVar1);
  do {
    pcVar4 = fgets(iobuf,200000,(FILE *)fp);
    if (pcVar4 == (char *)0x0) {
      __size = HashVocab_serialize_size(vocab);
      rom = (char *)malloc(__size);
      local_30 = 0;
      param.offset = (size_t)rom;
      HashVocab_serialize(vocab,serializer,&local_30);
      if (local_30 == __size) {
        return;
      }
      __assert_fail("param.offset == size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/test_vocab.c"
                    ,0x44,"void ReadUTF8(FILE *)");
    }
    sVar5 = strlen(iobuf);
    if ((&DAT_001040af)[sVar5] == '\n') {
      (&DAT_001040af)[sVar5] = 0;
    }
    uVar2 = HashVocab_add(vocab,iobuf);
    uVar3 = HashVocab_id(vocab,iobuf);
  } while (uVar3 == uVar2);
  __assert_fail("HashVocab_id(vocab, iobuf) == id",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/test_vocab.c"
                ,0x37,"void ReadUTF8(FILE *)");
}

Assistant:

void ReadUTF8(FILE* fp)
{
    fgets((char*)iobuf, sizeof(iobuf), fp);
    int word_num = atoi(iobuf);
    vocab = HashVocab_init(word_num);
    while( fgets((char*)iobuf, sizeof(iobuf), fp))
    {
        size_t len = strlen(iobuf);
        if (iobuf[len-1] == '\n') {
            iobuf[len-1] = 0;
        }
        uint32_t id = HashVocab_add(vocab, iobuf);
        //printf("%s:%d\n", iobuf, id);
        assert(HashVocab_id(vocab, iobuf) == id);
    }

    //for (int i = 0; i< word_num;i++) {
    //    fprintf(stderr, "%d:%s\n", i, HashVocab_word(vocab,i));
    //}

    size_t size = HashVocab_serialize_size(vocab);
    rom = malloc(size);
    SerializerParam param;
    param.ptr = rom;
    param.offset = 0;
    HashVocab_serialize(vocab,serializer, &param);
    assert(param.offset == size);
}